

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O0

void ihevc_itrans_16x16(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                       WORD32 i4_shift,WORD32 zero_cols)

{
  int iVar1;
  byte bVar2;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  short *in_RDI;
  undefined4 in_R8D;
  uint in_R9D;
  WORD32 add;
  WORD32 eeo [2];
  WORD32 eee [2];
  WORD32 eo [4];
  WORD32 ee [4];
  WORD32 o [8];
  WORD32 e [8];
  WORD32 k;
  WORD32 j;
  undefined2 local_ac;
  undefined2 local_a8;
  undefined2 local_a4;
  undefined2 local_a0;
  int local_98 [4];
  int aiStack_88 [16];
  int aiStack_48 [8];
  int local_28;
  int local_24;
  uint local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  void *local_10;
  short *local_8;
  
  iVar1 = 1 << ((char)in_R8D - 1U & 0x1f);
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    if ((local_20 & 1) == 1) {
      memset(local_10,0,0x20);
    }
    else {
      for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
        local_98[(long)local_28 + 0xc] =
             (int)g_ai2_ihevc_trans_16[1][local_28] * (int)local_8[local_14] +
             (int)g_ai2_ihevc_trans_16[3][local_28] * (int)local_8[local_14 * 3] +
             (int)g_ai2_ihevc_trans_16[5][local_28] * (int)local_8[local_14 * 5] +
             (int)g_ai2_ihevc_trans_16[7][local_28] * (int)local_8[local_14 * 7] +
             (int)g_ai2_ihevc_trans_16[9][local_28] * (int)local_8[local_14 * 9] +
             (int)g_ai2_ihevc_trans_16[0xb][local_28] * (int)local_8[local_14 * 0xb] +
             (int)g_ai2_ihevc_trans_16[0xd][local_28] * (int)local_8[local_14 * 0xd] +
             (int)g_ai2_ihevc_trans_16[0xf][local_28] * (int)local_8[local_14 * 0xf];
      }
      for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
        local_98[(long)local_28 + 4] =
             (int)g_ai2_ihevc_trans_16[2][local_28] * (int)local_8[local_14 << 1] +
             (int)g_ai2_ihevc_trans_16[6][local_28] * (int)local_8[local_14 * 6] +
             (int)g_ai2_ihevc_trans_16[10][local_28] * (int)local_8[local_14 * 10] +
             (int)g_ai2_ihevc_trans_16[0xe][local_28] * (int)local_8[local_14 * 0xe];
      }
      local_98[0] = local_8[local_14 << 2] * 0x53 + local_8[local_14 * 0xc] * 0x24;
      local_98[2] = *local_8 * 0x40 + local_8[local_14 << 3] * 0x40;
      local_98[1] = local_8[local_14 << 2] * 0x24 + local_8[local_14 * 0xc] * -0x53;
      local_98[3] = *local_8 * 0x40 + local_8[local_14 << 3] * -0x40;
      for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
        local_98[(long)local_28 + 8] = local_98[(long)local_28 + 2] + local_98[local_28];
        local_98[(long)(local_28 + 2) + 8] =
             local_98[(long)(1 - local_28) + 2] - local_98[1 - local_28];
      }
      for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
        aiStack_48[local_28] = local_98[(long)local_28 + 8] + local_98[(long)local_28 + 4];
        aiStack_48[local_28 + 4] =
             local_98[(long)(3 - local_28) + 8] - local_98[(long)(3 - local_28) + 4];
      }
      for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
        bVar2 = (byte)local_1c;
        if (aiStack_48[local_28] + local_98[(long)local_28 + 0xc] + iVar1 >> (bVar2 & 0x1f) < 0x8000
           ) {
          if (aiStack_48[local_28] + local_98[(long)local_28 + 0xc] + iVar1 >> (bVar2 & 0x1f) <
              -0x8000) {
            local_a4 = 0x8000;
          }
          else {
            local_a4 = (undefined2)
                       (aiStack_48[local_28] + local_98[(long)local_28 + 0xc] + iVar1 >>
                       (bVar2 & 0x1f));
          }
          local_a0 = local_a4;
        }
        else {
          local_a0 = 0x7fff;
        }
        *(undefined2 *)((long)local_10 + (long)local_28 * 2) = local_a0;
        if ((aiStack_48[7 - local_28] - local_98[(long)(7 - local_28) + 0xc]) + iVar1 >>
            (bVar2 & 0x1f) < 0x8000) {
          if ((aiStack_48[7 - local_28] - local_98[(long)(7 - local_28) + 0xc]) + iVar1 >>
              (bVar2 & 0x1f) < -0x8000) {
            local_ac = 0x8000;
          }
          else {
            local_ac = (undefined2)
                       ((aiStack_48[7 - local_28] - local_98[(long)(7 - local_28) + 0xc]) + iVar1 >>
                       (bVar2 & 0x1f));
          }
          local_a8 = local_ac;
        }
        else {
          local_a8 = 0x7fff;
        }
        *(undefined2 *)((long)local_10 + (long)(local_28 + 8) * 2) = local_a8;
      }
    }
    local_8 = local_8 + 1;
    local_10 = (void *)((long)local_10 + (long)local_18 * 2);
    local_20 = (int)local_20 >> 1;
  }
  return;
}

Assistant:

void ihevc_itrans_16x16(WORD16 *pi2_src,
                        WORD16 *pi2_dst,
                        WORD32 src_strd,
                        WORD32 dst_strd,
                        WORD32 i4_shift,
                        WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[8], o[8];
    WORD32 ee[4], eo[4];
    WORD32 eee[2], eeo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_16; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_16 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 8; k++)
            {
                o[k] = g_ai2_ihevc_trans_16[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_16[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_16[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_16[7][k]
                                                * pi2_src[7 * src_strd]
                                + g_ai2_ihevc_trans_16[9][k]
                                                * pi2_src[9 * src_strd]
                                + g_ai2_ihevc_trans_16[11][k]
                                                * pi2_src[11 * src_strd]
                                + g_ai2_ihevc_trans_16[13][k]
                                                * pi2_src[13 * src_strd]
                                + g_ai2_ihevc_trans_16[15][k]
                                                * pi2_src[15 * src_strd];
            }
            for(k = 0; k < 4; k++)
            {
                eo[k] = g_ai2_ihevc_trans_16[2][k] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_16[6][k]
                                                * pi2_src[6 * src_strd]
                                + g_ai2_ihevc_trans_16[10][k]
                                                * pi2_src[10 * src_strd]
                                + g_ai2_ihevc_trans_16[14][k]
                                                * pi2_src[14 * src_strd];
            }
            eeo[0] = g_ai2_ihevc_trans_16[4][0] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][0]
                                            * pi2_src[12 * src_strd];
            eee[0] =
                            g_ai2_ihevc_trans_16[0][0] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][0]
                                                            * pi2_src[8
                                                                            * src_strd];
            eeo[1] = g_ai2_ihevc_trans_16[4][1] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][1]
                                            * pi2_src[12 * src_strd];
            eee[1] =
                            g_ai2_ihevc_trans_16[0][1] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][1]
                                                            * pi2_src[8
                                                                            * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            for(k = 0; k < 2; k++)
            {
                ee[k] = eee[k] + eeo[k];
                ee[k + 2] = eee[1 - k] - eeo[1 - k];
            }
            for(k = 0; k < 4; k++)
            {
                e[k] = ee[k] + eo[k];
                e[k + 4] = ee[3 - k] - eo[3 - k];
            }
            for(k = 0; k < 8; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 8] =
                                CLIP_S16(((e[7 - k] - o[7 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}